

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::IteratorIndexMethod::checkArguments
          (IteratorIndexMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  long lVar2;
  bool bVar3;
  Type *pTVar4;
  Type *pTVar5;
  Diagnostic *this_00;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar3 = SystemSubroutine::checkArgCount(&this->super_SystemSubroutine,context,true,args,range,0,1)
  ;
  if (bVar3) {
    if (1 < (args->_M_extent)._M_extent_value) {
      bVar3 = Type::isIntegral((args->_M_ptr[1]->type).ptr);
      if (!bVar3) {
        pTVar5 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,args->_M_ptr[1]);
        return pTVar5;
      }
    }
    lVar2 = *(long *)(*args->_M_ptr + 1);
    pTVar5 = *(Type **)(lVar2 + 0x160);
    pTVar4 = pTVar5->canonical;
    if (pTVar4 == (Type *)0x0) {
      Type::resolveCanonical(pTVar5);
      pTVar4 = pTVar5->canonical;
    }
    if ((pTVar4->super_Symbol).kind == AssociativeArrayType) {
      pTVar5 = Type::getAssociativeIndexType(*(Type **)(lVar2 + 0x160));
      if (pTVar5 == (Type *)0x0) {
        this_00 = ASTContext::addDiag(context,(DiagCode)0x3000b,range);
        Diagnostic::operator<<(this_00,&(this->super_SystemSubroutine).name);
        pTVar5 = pCVar1->errorType;
      }
    }
    else {
      pTVar5 = pCVar1->intType;
    }
  }
  else {
    pTVar5 = pCVar1->errorType;
  }
  return pTVar5;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 1))
            return comp.getErrorType();

        if (args.size() > 1 && !args[1]->type->isIntegral())
            return badArg(context, *args[1]);

        auto& iterator = args[0]->as<NamedValueExpression>().symbol.as<IteratorSymbol>();
        if (iterator.arrayType.isAssociativeArray()) {
            auto indexType = iterator.arrayType.getAssociativeIndexType();
            if (!indexType) {
                context.addDiag(diag::AssociativeWildcardNotAllowed, range) << name;
                return comp.getErrorType();
            }
            return *indexType;
        }

        return comp.getIntType();
    }